

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

uint8_t * WebPDecodeYUVInto(uint8_t *data,size_t data_size,uint8_t *luma,size_t luma_size,
                           int luma_stride,uint8_t *u,size_t u_size,int u_stride,uint8_t *v,
                           size_t v_size,int v_stride)

{
  int iVar1;
  VP8StatusCode VVar2;
  WebPDecParams *in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  undefined4 in_R8D;
  undefined8 in_R9;
  WebPDecBuffer output;
  WebPDecParams params;
  undefined4 local_120 [3];
  undefined4 local_114;
  undefined8 local_108;
  undefined4 local_f0;
  undefined4 *local_a8;
  undefined8 local_38;
  undefined4 local_2c;
  uint8_t *local_8;
  
  if ((in_RDX == (uint8_t *)0x0) ||
     (local_38 = in_R9, local_2c = in_R8D, iVar1 = WebPInitDecBuffer((WebPDecBuffer *)0x112852),
     iVar1 == 0)) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    WebPResetDecParams((WebPDecParams *)0x112875);
    local_a8 = local_120;
    local_120[0] = 0xb;
    local_f0 = local_2c;
    local_108 = local_38;
    local_114 = 1;
    VVar2 = DecodeInto(in_RSI,(size_t)in_RDX,in_RCX);
    local_8 = in_RDX;
    if (VVar2 != VP8_STATUS_OK) {
      local_8 = (uint8_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

uint8_t* WebPDecodeYUVInto(const uint8_t* data, size_t data_size,
                           uint8_t* luma, size_t luma_size, int luma_stride,
                           uint8_t* u, size_t u_size, int u_stride,
                           uint8_t* v, size_t v_size, int v_stride) {
  WebPDecParams params;
  WebPDecBuffer output;
  if (luma == NULL || !WebPInitDecBuffer(&output)) return NULL;
  WebPResetDecParams(&params);
  params.output = &output;
  output.colorspace      = MODE_YUV;
  output.u.YUVA.y        = luma;
  output.u.YUVA.y_stride = luma_stride;
  output.u.YUVA.y_size   = luma_size;
  output.u.YUVA.u        = u;
  output.u.YUVA.u_stride = u_stride;
  output.u.YUVA.u_size   = u_size;
  output.u.YUVA.v        = v;
  output.u.YUVA.v_stride = v_stride;
  output.u.YUVA.v_size   = v_size;
  output.is_external_memory = 1;
  if (DecodeInto(data, data_size, &params) != VP8_STATUS_OK) {
    return NULL;
  }
  return luma;
}